

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterSetNext(Fts5Index *p,Fts5SegIter *pIter)

{
  Fts5SegIter *pIter_local;
  Fts5Index *p_local;
  
  if ((pIter->flags & 2U) == 0) {
    if (p->pConfig->eDetail == 1) {
      pIter->xNext = fts5SegIterNext_None;
    }
    else {
      pIter->xNext = fts5SegIterNext;
    }
  }
  else {
    pIter->xNext = fts5SegIterNext_Reverse;
  }
  return;
}

Assistant:

static void fts5SegIterSetNext(Fts5Index *p, Fts5SegIter *pIter){
  if( pIter->flags & FTS5_SEGITER_REVERSE ){
    pIter->xNext = fts5SegIterNext_Reverse;
  }else if( p->pConfig->eDetail==FTS5_DETAIL_NONE ){
    pIter->xNext = fts5SegIterNext_None;
  }else{
    pIter->xNext = fts5SegIterNext;
  }
}